

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  cmake *this_01;
  char *pcVar4;
  cmMakefile *pcVar5;
  undefined4 extraout_var;
  pointer pVVar6;
  reference __lhs;
  char *pcVar7;
  pointer this_02;
  Value *pVVar8;
  pointer pcVar9;
  reference pbVar10;
  pointer ppVar11;
  mapped_type *pmVar12;
  const_iterator cVar13;
  undefined1 local_1180 [8];
  cmGeneratedFileStream tmf;
  undefined1 local_f18 [8];
  string target_mods_file;
  allocator local_ed1;
  key_type local_ed0;
  string local_eb0;
  _Self local_e90;
  _Self local_e88;
  iterator m;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e78;
  iterator i_5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e48;
  iterator i_4;
  cmNinjaVars ddVars;
  cmNinjaDeps ddOrderOnlyDeps;
  cmNinjaDeps ddImplicitDeps;
  cmNinjaDeps ddExplicitDeps;
  cmNinjaDeps ddImplicitOuts;
  cmNinjaDeps ddOutputs;
  undefined1 local_d90 [8];
  string ddRule;
  string ddComment;
  __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
  local_d48;
  iterator oi_1;
  cmGeneratedFileStream ddf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  undefined1 local_ab0 [8];
  string mod;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a88;
  iterator i_3;
  __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
  local_a78;
  iterator oi;
  Value tm;
  string local_a20;
  string local_a00;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  iterator i_2;
  undefined1 local_9a0 [8];
  Reader reader_1;
  ifstream ltmf;
  undefined1 local_688 [8];
  Value ltm;
  string ltmn;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_638;
  const_iterator di;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  SelfType local_5d0;
  _Base_ptr local_5c0;
  undefined1 local_5b8;
  undefined1 local_5b0 [8];
  const_iterator i_1;
  Value *ddi_requires;
  _Base_ptr local_578;
  undefined1 local_570;
  SelfType local_568;
  _Base_ptr local_558;
  undefined1 local_550;
  undefined1 local_548 [8];
  const_iterator i;
  Value *ddi_provides;
  undefined1 local_510 [8];
  cmFortranObjectInfo info;
  string local_4b8;
  undefined1 local_498 [8];
  Reader reader;
  ifstream ddif;
  Value *ddi;
  Value ddio;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  const_iterator ddii;
  vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> objects;
  cmMakefile *local_120;
  auto_ptr<cmLocalNinjaGenerator> local_118;
  auto_ptr<cmLocalNinjaGenerator> lgd;
  auto_ptr<cmMakefile> local_100;
  auto_ptr<cmMakefile> mfd;
  cmStateDirectory local_d0;
  cmStateDirectory local_a8;
  cmStateDirectory local_80;
  undefined1 local_58 [8];
  cmStateSnapshot snapshot;
  string *arg_dd_local;
  string *dir_cur_bld_local;
  string *dir_cur_src_local;
  string *dir_top_bld_local;
  string *dir_top_src_local;
  cmGlobalNinjaGenerator *this_local;
  
  snapshot.Position.Position = (PositionType)arg_dd;
  this_01 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_58,this_01);
  cmStateSnapshot::GetDirectory(&local_80,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentSource(&local_80,dir_cur_src);
  cmStateSnapshot::GetDirectory(&local_a8,(cmStateSnapshot *)local_58);
  cmStateDirectory::SetCurrentBinary(&local_a8,dir_cur_bld);
  cmStateSnapshot::GetDirectory(&local_d0,(cmStateSnapshot *)local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmStateDirectory::SetRelativePathTopSource(&local_d0,pcVar4);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&mfd,(cmStateSnapshot *)local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)&mfd,pcVar4);
  pcVar5 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(pcVar5,(cmGlobalGenerator *)this,(cmStateSnapshot *)local_58);
  ::cm::auto_ptr<cmMakefile>::auto_ptr(&local_100,pcVar5);
  pcVar5 = ::cm::auto_ptr<cmMakefile>::get(&local_100);
  iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2]
          )(this,pcVar5);
  ::cm::auto_ptr<cmLocalNinjaGenerator>::auto_ptr
            (&local_118,(cmLocalNinjaGenerator *)CONCAT44(extraout_var,iVar2));
  local_120 = ::cm::auto_ptr<cmMakefile>::release(&local_100);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
            (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,&local_120);
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::cm::auto_ptr<cmLocalNinjaGenerator>::release(&local_118);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
            (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (value_type *)
             &objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::cm::auto_ptr<cmLocalNinjaGenerator>::~auto_ptr(&local_118);
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_100);
  std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::vector
            ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
  local_148._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(arg_ddis);
  while( true ) {
    ddio.limit_ = (size_t)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end(arg_ddis);
    bVar1 = __gnu_cxx::operator!=
                      (&local_148,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&ddio.limit_);
    if (!bVar1) break;
    Json::Value::Value((Value *)&ddi,nullValue);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_148);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&reader.features_,pcVar4,_Var3);
    Json::Reader::Reader((Reader *)local_498);
    bVar1 = Json::Reader::parse((Reader *)local_498,(istream *)&reader.features_,(Value *)&ddi,false
                               );
    if (bVar1) {
      cmFortranObjectInfo::cmFortranObjectInfo((cmFortranObjectInfo *)local_510);
      pVVar8 = Json::Value::operator[]((Value *)&ddi,"object");
      Json::Value::asString_abi_cxx11_((string *)&ddi_provides,pVVar8);
      std::__cxx11::string::operator=((string *)local_510,(string *)&ddi_provides);
      std::__cxx11::string::~string((string *)&ddi_provides);
      i.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)&ddi,"provides");
      bVar1 = Json::Value::isArray((Value *)i.super_ValueIteratorBase._8_8_);
      if (bVar1) {
        cVar13 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
        local_558 = (_Base_ptr)cVar13.super_ValueIteratorBase.current_._M_node;
        local_550 = cVar13.super_ValueIteratorBase.isNull_;
        local_548 = (undefined1  [8])local_558;
        i.super_ValueIteratorBase.current_._M_node._0_1_ = local_550;
        while( true ) {
          cVar13 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
          local_578 = (_Base_ptr)cVar13.super_ValueIteratorBase.current_._M_node;
          local_570 = cVar13.super_ValueIteratorBase.isNull_;
          local_568.current_._M_node = local_578;
          local_568.isNull_ = (bool)local_570;
          bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_548,&local_568);
          if (!bVar1) break;
          pVVar6 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_548);
          Json::Value::asString_abi_cxx11_((string *)&ddi_requires,pVVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&info.Object.field_2 + 8),(value_type *)&ddi_requires);
          std::__cxx11::string::~string((string *)&ddi_requires);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_548);
        }
      }
      i_1.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)&ddi,"requires");
      bVar1 = Json::Value::isArray((Value *)i_1.super_ValueIteratorBase._8_8_);
      if (bVar1) {
        cVar13 = Json::Value::begin((Value *)i_1.super_ValueIteratorBase._8_8_);
        local_5c0 = (_Base_ptr)cVar13.super_ValueIteratorBase.current_._M_node;
        local_5b8 = cVar13.super_ValueIteratorBase.isNull_;
        local_5b0 = (undefined1  [8])local_5c0;
        i_1.super_ValueIteratorBase.current_._M_node._0_1_ = local_5b8;
        while( true ) {
          cVar13 = Json::Value::end((Value *)i_1.super_ValueIteratorBase._8_8_);
          local_5d0.current_ = cVar13.super_ValueIteratorBase.current_._M_node;
          local_5d0.isNull_ = cVar13.super_ValueIteratorBase.isNull_;
          bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_5b0,&local_5d0);
          if (!bVar1) break;
          pVVar6 = Json::ValueConstIterator::operator->((ValueConstIterator *)local_5b0);
          Json::Value::asString_abi_cxx11_
                    ((string *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count,pVVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&info.Provides.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string
                    ((string *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_5b0);
        }
      }
      std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::push_back
                ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii,
                 (value_type *)local_510);
      cmFortranObjectInfo::~cmFortranObjectInfo((cmFortranObjectInfo *)local_510);
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_148);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_4b8,(Reader *)local_498);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",pcVar4,pcVar7,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_4b8);
      this_local._7_1_ = 0;
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    Json::Reader::~Reader((Reader *)local_498);
    std::ifstream::~ifstream(&reader.features_);
    Json::Value::~Value((Value *)&ddi);
    if (info.Requires.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_006fce10;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_148);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&di);
  local_638._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(linked_target_dirs);
  while( true ) {
    ltmn.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(linked_target_dirs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_638,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&ltmn.field_2 + 8));
    if (!bVar1) break;
    __lhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_638);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ltm.limit_,
                   __lhs,"/FortranModules.json");
    Json::Value::Value((Value *)local_688,nullValue);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(&reader_1.features_,pcVar4,_Var3);
    Json::Reader::Reader((Reader *)local_9a0);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&reader_1.features_.allowComments_ +
                              *(long *)(reader_1._264_8_ + -0x18)));
    if ((!bVar1) ||
       (bVar1 = Json::Reader::parse((Reader *)local_9a0,(istream *)&reader_1.features_,
                                    (Value *)local_688,false), bVar1)) {
      bVar1 = Json::Value::isObject((Value *)local_688);
      if (bVar1) {
        Json::Value::begin((Value *)local_9d0);
        while( true ) {
          Json::Value::end((Value *)local_9e0);
          bVar1 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)local_9d0,(SelfType *)local_9e0);
          if (!bVar1) break;
          this_02 = Json::ValueIterator::operator->((ValueIterator *)local_9d0);
          Json::Value::asString_abi_cxx11_(&local_a00,this_02);
          Json::ValueIteratorBase::key((Value *)&tm.limit_,(ValueIteratorBase *)local_9d0);
          Json::Value::asString_abi_cxx11_(&local_a20,(Value *)&tm.limit_);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&di,&local_a20);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_a00);
          std::__cxx11::string::~string((string *)&local_a20);
          Json::Value::~Value((Value *)&tm.limit_);
          std::__cxx11::string::~string((string *)&local_a00);
          Json::ValueIterator::operator++((ValueIterator *)local_9d0);
        }
      }
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_638);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Json::Reader::getFormattedErrorMessages_abi_cxx11_
                ((string *)&i_2.super_ValueIteratorBase.isNull_,(Reader *)local_9a0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",pcVar4,pcVar7,(char *)0x0);
      std::__cxx11::string::~string((string *)&i_2.super_ValueIteratorBase.isNull_);
      this_local._7_1_ = 0;
      info.Requires.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    Json::Reader::~Reader((Reader *)local_9a0);
    std::ifstream::~ifstream(&reader_1.features_);
    Json::Value::~Value((Value *)local_688);
    std::__cxx11::string::~string((string *)&ltm.limit_);
    if (info.Requires.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_006fcdf4;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_638);
  }
  Json::Value::Value((Value *)&oi,objectValue);
  local_a78._M_current =
       (cmFortranObjectInfo *)
       std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::begin
                 ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
  while( true ) {
    i_3._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::end
                   ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a78,
                       (__normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
                        *)&i_3);
    if (!bVar1) break;
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
             ::operator->(&local_a78);
    local_a88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar9->Provides);
    while( true ) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
               ::operator->(&local_a78);
      mod.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar9->Provides);
      bVar1 = __gnu_cxx::operator!=
                        (&local_a88,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&mod.field_2 + 8));
      if (!bVar1) break;
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_a88);
      std::operator+(&local_ad0,module_dir,pbVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ab0,
                     &local_ad0,".mod");
      std::__cxx11::string::~string((string *)&local_ad0);
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_a88);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&di,pbVar10);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_ab0);
      Json::Value::Value((Value *)&ddf.field_0x240,(string *)local_ab0);
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_a88);
      pVVar8 = Json::Value::operator[]((Value *)&oi,pbVar10);
      Json::Value::operator=(pVVar8,(Value *)&ddf.field_0x240);
      Json::Value::~Value((Value *)&ddf.field_0x240);
      std::__cxx11::string::~string((string *)local_ab0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_a88);
    }
    __gnu_cxx::
    __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
    ::operator++(&local_a78);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&oi_1,pcVar4,false,None);
  std::operator<<((ostream *)&oi_1,"ninja_dyndep_version = 1.0\n");
  local_d48._M_current =
       (cmFortranObjectInfo *)
       std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::begin
                 ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
  while( true ) {
    ddComment.field_2._8_8_ =
         std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::end
                   ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d48,
                       (__normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
                        *)((long)&ddComment.field_2 + 8));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)(ddRule.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d90,"dyndep",
               (allocator *)
               ((long)&ddOutputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ddOutputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = &ddImplicitOuts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ddExplicitDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ddImplicitDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ddOrderOnlyDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ddVars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&i_4);
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
             ::operator->(&local_d48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,&pcVar9->Object);
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
             ::operator->(&local_d48);
    local_e48._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar9->Provides);
    while( true ) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
               ::operator->(&local_d48);
      local_e50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar9->Provides);
      bVar1 = __gnu_cxx::operator!=(&local_e48,&local_e50);
      if (!bVar1) break;
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_e48);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&di,pbVar10);
      ConvertToNinjaPath((string *)&i_5,this,pmVar12);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ddExplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i_5);
      std::__cxx11::string::~string((string *)&i_5);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e48);
    }
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
             ::operator->(&local_d48);
    local_e78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar9->Requires);
    while( true ) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
               ::operator->(&local_d48);
      m._M_node = (_Base_ptr)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&pcVar9->Requires);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e78,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&m);
      if (!bVar1) break;
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_e78);
      local_e88._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&di,pbVar10);
      local_e90._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&di);
      bVar1 = std::operator!=(&local_e88,&local_e90);
      if (bVar1) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_e88);
        ConvertToNinjaPath(&local_eb0,this,&ppVar11->second);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ddOrderOnlyDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_eb0);
        std::__cxx11::string::~string((string *)&local_eb0);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e78);
    }
    pcVar9 = __gnu_cxx::
             __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
             ::operator->(&local_d48);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pcVar9->Provides);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ed0,"restat",&local_ed1);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&i_4,&local_ed0);
      std::__cxx11::string::operator=((string *)pmVar12,"1");
      std::__cxx11::string::~string((string *)&local_ed0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
    }
    std::__cxx11::string::string((string *)(target_mods_file.field_2._M_local_buf + 8));
    WriteBuild(this,(ostream *)&oi_1,(string *)((long)&ddRule.field_2 + 8),(string *)local_d90,
               (cmNinjaDeps *)
               &ddImplicitOuts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmNinjaDeps *)
               &ddExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmNinjaDeps *)
               &ddImplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmNinjaDeps *)
               &ddOrderOnlyDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmNinjaDeps *)&ddVars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (cmNinjaVars *)&i_4,(string *)(target_mods_file.field_2._M_local_buf + 8),0,
               (bool *)0x0);
    std::__cxx11::string::~string((string *)(target_mods_file.field_2._M_local_buf + 8));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&i_4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddVars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddOrderOnlyDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddImplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ddImplicitOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_d90);
    std::__cxx11::string::~string((string *)(ddRule.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<cmFortranObjectInfo_*,_std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>_>
    ::operator++(&local_d48);
  }
  cmsys::SystemTools::GetFilenamePath
            ((string *)&tmf.field_0x240,(string *)snapshot.Position.Position);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tmf.field_0x240,"/FortranModules.json");
  std::__cxx11::string::~string((string *)&tmf.field_0x240);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_1180,pcVar4,false,None);
  Json::operator<<((ostream *)local_1180,(Value *)&oi);
  this_local._7_1_ = 1;
  info.Requires.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1180);
  std::__cxx11::string::~string((string *)local_f18);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&oi_1);
  Json::Value::~Value((Value *)&oi);
LAB_006fcdf4:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&di);
LAB_006fce10:
  std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::~vector
            ((vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> *)&ddii);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    CM_AUTO_PTR<cmMakefile> mfd(new cmMakefile(this, snapshot));
    CM_AUTO_PTR<cmLocalNinjaGenerator> lgd(static_cast<cmLocalNinjaGenerator*>(
      this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmFortranObjectInfo> objects;
  for (std::vector<std::string>::const_iterator ddii = arg_ddis.begin();
       ddii != arg_ddis.end(); ++ddii) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(ddii->c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           ddii->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }

    cmFortranObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (Json::Value::const_iterator i = ddi_provides.begin();
           i != ddi_provides.end(); ++i) {
        info.Provides.push_back(i->asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (Json::Value::const_iterator i = ddi_requires.begin();
           i != ddi_requires.end(); ++i) {
        info.Requires.push_back(i->asString());
      }
    }
    objects.push_back(info);
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::vector<std::string>::const_iterator di =
         linked_target_dirs.begin();
       di != linked_target_dirs.end(); ++di) {
    std::string const ltmn = *di + "/FortranModules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           di->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      std::string const mod = module_dir + *i + ".mod";
      mod_files[*i] = mod;
      tm[*i] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd.c_str());
  ddf << "ninja_dyndep_version = 1.0\n";

  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    std::string const ddComment;
    std::string const ddRule = "dyndep";
    cmNinjaDeps ddOutputs;
    cmNinjaDeps ddImplicitOuts;
    cmNinjaDeps ddExplicitDeps;
    cmNinjaDeps ddImplicitDeps;
    cmNinjaDeps ddOrderOnlyDeps;
    cmNinjaVars ddVars;

    ddOutputs.push_back(oi->Object);
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      ddImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[*i]));
    }
    for (std::vector<std::string>::iterator i = oi->Requires.begin();
         i != oi->Requires.end(); ++i) {
      std::map<std::string, std::string>::iterator m = mod_files.find(*i);
      if (m != mod_files.end()) {
        ddImplicitDeps.push_back(this->ConvertToNinjaPath(m->second));
      }
    }
    if (!oi->Provides.empty()) {
      ddVars["restat"] = "1";
    }

    this->WriteBuild(ddf, ddComment, ddRule, ddOutputs, ddImplicitOuts,
                     ddExplicitDeps, ddImplicitDeps, ddOrderOnlyDeps, ddVars);
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/FortranModules.json";
  cmGeneratedFileStream tmf(target_mods_file.c_str());
  tmf << tm;

  return true;
}